

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O1

void __thiscall
btConnectivityProcessor::processTriangle
          (btConnectivityProcessor *this,btVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btTriangleInfoMap *pbVar3;
  btVector3 *pbVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  btVector3 *pbVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  btScalar *pbVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  btVector3 *pbVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  btVector3 bVar41;
  btVector3 normalB;
  btVector3 normalA;
  btTriangleShape tB;
  btTriangleShape tA;
  float local_218;
  float fStack_214;
  float local_208;
  float fStack_204;
  float local_1e8;
  float fStack_1e4;
  btVector3 local_1d0;
  int local_1c0 [4];
  undefined8 local_1b0;
  undefined4 local_1a8;
  btVector3 local_1a0;
  btTriangleInfo *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  btQuaternion local_140;
  btTriangleShape local_130;
  undefined1 local_b0 [8];
  btScalar bStack_a8;
  btScalar local_a4;
  btScalar local_60 [2];
  btScalar abStack_58 [2];
  btScalar local_50 [2];
  btScalar abStack_48 [2];
  btScalar local_40 [2];
  btScalar abStack_38 [2];
  
  iVar6 = this->m_partIdA;
  uVar8 = this->m_triangleIndexA;
  if (triangleIndex != uVar8 || partId != iVar6) {
    local_1c0[2] = 0xffffffff;
    local_1c0[0] = -1;
    local_1c0[1] = -1;
    local_1a8 = 0xffffffff;
    local_1b0 = 0xffffffffffffffff;
    fVar21 = triangle[1].m_floats[0] - triangle->m_floats[0];
    fVar26 = triangle[1].m_floats[1] - triangle->m_floats[1];
    fVar23 = triangle[1].m_floats[2] - triangle->m_floats[2];
    fVar30 = triangle[2].m_floats[0] - triangle->m_floats[0];
    fVar24 = triangle[2].m_floats[1] - triangle->m_floats[1];
    fVar25 = triangle[2].m_floats[2] - triangle->m_floats[2];
    fVar27 = fVar26 * fVar25 - fVar24 * fVar23;
    fVar23 = fVar23 * fVar30 - fVar25 * fVar21;
    fVar24 = fVar24 * fVar21 - fVar30 * fVar26;
    pbVar3 = this->m_triangleInfoMap;
    fVar21 = pbVar3->m_equalVertexThreshold;
    if ((fVar21 <= fVar24 * fVar24 + fVar27 * fVar27 + fVar23 * fVar23) &&
       (pbVar9 = this->m_triangleVerticesA, fVar23 = pbVar9[1].m_floats[0] - pbVar9->m_floats[0],
       fVar27 = pbVar9[1].m_floats[1] - pbVar9->m_floats[1],
       fVar24 = pbVar9[1].m_floats[2] - pbVar9->m_floats[2],
       fVar31 = pbVar9[2].m_floats[0] - pbVar9->m_floats[0],
       fVar25 = pbVar9[2].m_floats[1] - pbVar9->m_floats[1],
       fVar26 = pbVar9[2].m_floats[2] - pbVar9->m_floats[2],
       fVar30 = fVar27 * fVar26 - fVar25 * fVar24, fVar24 = fVar24 * fVar31 - fVar26 * fVar23,
       fVar23 = fVar25 * fVar23 - fVar31 * fVar27,
       fVar21 <= fVar23 * fVar23 + fVar30 * fVar30 + fVar24 * fVar24)) {
      uVar10 = 0;
      bVar20 = false;
      iVar11 = 0;
      do {
        fVar23 = pbVar9[uVar10].m_floats[0];
        fVar24 = pbVar9[uVar10].m_floats[1];
        fVar25 = pbVar9[uVar10].m_floats[2];
        bVar19 = true;
        uVar14 = 0;
        pbVar13 = triangle->m_floats + 2;
        do {
          fVar26 = fVar23 - ((btVector3 *)(pbVar13 + -2))->m_floats[0];
          fVar27 = fVar24 - pbVar13[-1];
          fVar30 = fVar25 - *pbVar13;
          if (fVar30 * fVar30 + fVar26 * fVar26 + fVar27 * fVar27 < fVar21) {
            local_1c0[iVar11] = (int)uVar10;
            *(int *)((long)&local_1b0 + (long)iVar11 * 4) = (int)uVar14;
            iVar12 = iVar11 + 1;
            bVar5 = 1 < iVar11;
            iVar11 = iVar12;
            if (bVar5) break;
          }
          bVar19 = uVar14 < 2;
          uVar14 = uVar14 + 1;
          pbVar13 = pbVar13 + 4;
        } while (uVar14 != 3);
        if ((bVar19) || (2 < iVar11)) break;
        bVar20 = 1 < uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
      if ((bool)(iVar11 == 2 & bVar20)) {
        if ((local_1c0[0] == 0) && (local_1c0[1] == 2)) {
          local_1c0[0] = 2;
          local_1c0[1] = 0;
          local_1b0 = CONCAT44((int)local_1b0,(int)((ulong)local_1b0 >> 0x20));
        }
        uVar8 = iVar6 << 0x15 | uVar8;
        local_b0._0_4_ = uVar8;
        iVar6 = btHashMap<btHashInt,_btTriangleInfo>::findIndex
                          (&pbVar3->super_btInternalTriangleInfoMap,(btHashInt *)local_b0);
        local_190 = (btTriangleInfo *)0x0;
        if (iVar6 != -1) {
          local_190 = (pbVar3->super_btInternalTriangleInfoMap).m_valueArray.m_data + iVar6;
        }
        if (local_190 == (btTriangleInfo *)0x0) {
          local_b0._4_4_ = 6.2831855;
          bStack_a8 = 6.2831855;
          local_a4 = 6.2831855;
          local_b0._0_4_ = 0;
          local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
          super_btCollisionShape._vptr_btCollisionShape._0_4_ = uVar8;
          btHashMap<btHashInt,_btTriangleInfo>::insert
                    (&this->m_triangleInfoMap->super_btInternalTriangleInfoMap,
                     (btHashInt *)&local_130,(btTriangleInfo *)local_b0);
          pbVar3 = this->m_triangleInfoMap;
          local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
          super_btCollisionShape._vptr_btCollisionShape =
               (_func_int **)
               CONCAT44(local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.
                        super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape._4_4_,
                        uVar8);
          iVar6 = btHashMap<btHashInt,_btTriangleInfo>::findIndex
                            (&pbVar3->super_btInternalTriangleInfoMap,(btHashInt *)&local_130);
          local_190 = (btTriangleInfo *)0x0;
          if (iVar6 != -1) {
            local_190 = (pbVar3->super_btInternalTriangleInfoMap).m_valueArray.m_data + iVar6;
          }
        }
        lVar15 = (long)local_1c0[0];
        lVar7 = (long)local_1c0[1];
        pbVar9 = this->m_triangleVerticesA;
        fVar21 = pbVar9[lVar7].m_floats[0] - pbVar9[lVar15].m_floats[0];
        uVar1 = *(undefined8 *)(pbVar9[lVar7].m_floats + 1);
        uVar2 = *(undefined8 *)(pbVar9[lVar15].m_floats + 1);
        btPolyhedralConvexShape::btPolyhedralConvexShape((btPolyhedralConvexShape *)local_b0);
        local_b0._0_4_ = 0x224110;
        local_b0._4_4_ = 0.0;
        bStack_a8 = 1.4013e-45;
        local_60 = *(btScalar (*) [2])pbVar9->m_floats;
        abStack_58 = *(btScalar (*) [2])(pbVar9->m_floats + 2);
        local_50 = *(btScalar (*) [2])pbVar9[1].m_floats;
        abStack_48 = *(btScalar (*) [2])(pbVar9[1].m_floats + 2);
        local_40 = *(btScalar (*) [2])pbVar9[2].m_floats;
        abStack_38 = *(btScalar (*) [2])(pbVar9[2].m_floats + 2);
        iVar6 = (int)local_1b0;
        lVar17 = (long)(int)local_1b0;
        iVar11 = local_1b0._4_4_;
        lVar16 = (long)local_1b0._4_4_;
        btPolyhedralConvexShape::btPolyhedralConvexShape(&local_130.super_btPolyhedralConvexShape);
        pbVar18 = triangle + lVar17;
        pbVar9 = triangle + ((3 - iVar11) - iVar6);
        local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape._vptr_btCollisionShape =
             (_func_int **)&PTR__btPolyhedralConvexShape_00224110;
        local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape.m_shapeType = 1;
        local_130.m_vertices1[0].m_floats._0_8_ = *(undefined8 *)triangle[lVar16].m_floats;
        local_130.m_vertices1[0].m_floats._8_8_ = *(undefined8 *)(triangle[lVar16].m_floats + 2);
        local_130.m_vertices1[1].m_floats._0_8_ = *(undefined8 *)pbVar18->m_floats;
        local_130.m_vertices1[1].m_floats._8_8_ = *(undefined8 *)(pbVar18->m_floats + 2);
        local_130.m_vertices1[2].m_floats._0_8_ = *(undefined8 *)pbVar9->m_floats;
        local_130.m_vertices1[2].m_floats._8_8_ = *(undefined8 *)(pbVar9->m_floats + 2);
        btTriangleShape::calcNormal((btTriangleShape *)local_b0,&local_1a0);
        btTriangleShape::calcNormal(&local_130,&local_1d0);
        local_1e8 = (float)uVar1;
        fStack_1e4 = (float)((ulong)uVar1 >> 0x20);
        local_208 = (float)uVar2;
        fStack_204 = (float)((ulong)uVar2 >> 0x20);
        local_1e8 = local_1e8 - local_208;
        fStack_1e4 = fStack_1e4 - fStack_204;
        fVar23 = fStack_1e4 * fStack_1e4 + fVar21 * fVar21 + local_1e8 * local_1e8;
        if (fVar23 < 0.0) {
          fVar23 = sqrtf(fVar23);
        }
        else {
          fVar23 = SQRT(fVar23);
        }
        lVar16 = 3 - (lVar7 + lVar15);
        fVar23 = 1.0 / fVar23;
        fVar21 = fVar21 * fVar23;
        local_1e8 = local_1e8 * fVar23;
        fStack_1e4 = fStack_1e4 * fVar23;
        fVar27 = local_1a0.m_floats[2] * fVar23 * 0.0;
        fVar30 = local_1a0.m_floats[2] * fVar23 * 0.0;
        fVar26 = local_1a0.m_floats[2] * local_1e8 - local_1a0.m_floats[1] * fStack_1e4;
        fVar24 = local_1a0.m_floats[0] * fStack_1e4 - local_1a0.m_floats[2] * fVar21;
        fVar23 = local_1a0.m_floats[1] * fVar21 - local_1a0.m_floats[0] * local_1e8;
        fVar25 = fVar23 * fVar23 + fVar26 * fVar26 + fVar24 * fVar24;
        if (fVar25 < 0.0) {
          local_188 = CONCAT44(local_1a0.m_floats[2],fVar23);
          uStack_180 = 0;
          fVar25 = sqrtf(fVar25);
          fVar23 = (float)local_188;
        }
        else {
          fVar25 = SQRT(fVar25);
        }
        fVar25 = 1.0 / fVar25;
        pbVar4 = this->m_triangleVerticesA;
        fVar26 = fVar26 * fVar25;
        fVar24 = fVar24 * fVar25;
        fVar27 = (fVar27 - fStack_1e4 * 0.0) * fVar25;
        fVar30 = (fVar30 - fStack_1e4 * 0.0) * fVar25;
        fVar25 = fVar25 * fVar23;
        if ((pbVar4[lVar16].m_floats[2] - pbVar4[lVar15].m_floats[2]) * fVar25 +
            (pbVar4[lVar16].m_floats[0] - pbVar4[lVar15].m_floats[0]) * fVar26 +
            fVar24 * (pbVar4[lVar16].m_floats[1] - pbVar4[lVar15].m_floats[1]) < 0.0) {
          fVar26 = -fVar26;
          fVar24 = -fVar24;
          fVar27 = -fVar27;
          fVar30 = -fVar30;
          fVar25 = -fVar25;
        }
        fVar23 = local_1e8 * local_1d0.m_floats[2] + -fStack_1e4 * local_1d0.m_floats[1];
        fVar31 = fStack_1e4 * local_1d0.m_floats[0] + -fVar21 * local_1d0.m_floats[2];
        fVar28 = fVar21 * local_1d0.m_floats[1] + -local_1e8 * local_1d0.m_floats[0];
        fVar21 = fVar28 * fVar28 + fVar23 * fVar23 + fVar31 * fVar31;
        if (fVar21 < 0.0) {
          fVar21 = sqrtf(fVar21);
        }
        else {
          fVar21 = SQRT(fVar21);
        }
        fVar21 = 1.0 / fVar21;
        fVar23 = fVar23 * fVar21;
        fVar31 = fVar31 * fVar21;
        fVar21 = fVar21 * fVar28;
        fVar28 = 0.0;
        if ((pbVar9->m_floats[2] - pbVar18->m_floats[2]) * fVar21 +
            (pbVar9->m_floats[0] - pbVar18->m_floats[0]) * fVar23 +
            fVar31 * (pbVar9->m_floats[1] - pbVar18->m_floats[1]) < 0.0) {
          fVar23 = -fVar23;
          fVar31 = -fVar31;
          fVar21 = -fVar21;
        }
        fVar37 = fVar24 * fVar21 - fVar31 * fVar25;
        fVar32 = fVar25 * fVar23 - fVar21 * fVar26;
        fVar29 = fVar26 * fVar31 - fVar23 * fVar24;
        fVar22 = fVar29 * fVar29 + fVar37 * fVar37 + fVar32 * fVar32;
        if (this->m_triangleInfoMap->m_planarEpsilon <= fVar22) {
          local_188 = CONCAT44(fVar24,fVar24);
          uStack_180 = CONCAT44(fVar24,fVar24);
          if (fVar22 < 0.0) {
            uStack_154 = 0;
            uStack_150 = 0;
            uStack_14c = 0;
            local_178 = fVar29;
            fStack_174 = fVar24;
            fStack_170 = fVar27;
            fStack_16c = fVar30;
            local_168 = fVar37;
            fStack_164 = fVar24;
            fStack_160 = fVar24;
            fStack_15c = fVar24;
            local_158 = fVar32;
            fVar22 = sqrtf(fVar22);
            fVar29 = local_178;
            fVar24 = fStack_174;
            fVar27 = fStack_170;
            fVar30 = fStack_16c;
            fVar28 = (float)local_188;
            fVar32 = local_158;
            uVar34 = uStack_154;
            uVar35 = uStack_150;
            uVar36 = uStack_14c;
            fVar37 = local_168;
            fVar38 = fStack_164;
            fVar39 = fStack_160;
            fVar40 = fStack_15c;
          }
          else {
            fVar22 = SQRT(fVar22);
            fVar28 = fVar24;
            uVar34 = 0;
            uVar35 = 0;
            uVar36 = 0;
            fVar38 = fVar24;
            fVar39 = fVar24;
            fVar40 = fVar24;
          }
          fVar22 = 1.0 / fVar22;
          fVar33 = fVar32 * fVar22 * fVar25 - fVar28 * fVar29 * fVar22;
          fVar29 = fVar29 * fVar22 * fVar26 - fVar25 * fVar37 * fVar22;
          fVar32 = fVar37 * fVar22 * fVar28 - fVar26 * fVar32 * fVar22;
          fVar37 = fVar32 * fVar32 + fVar33 * fVar33 + fVar29 * fVar29;
          if (fVar37 < 0.0) {
            local_178 = fVar29;
            fStack_174 = fVar24;
            fStack_170 = fVar27;
            fStack_16c = fVar30;
            local_168 = fVar32;
            fStack_164 = fVar38;
            fStack_160 = fVar39;
            fStack_15c = fVar40;
            local_158 = fVar33;
            uStack_154 = uVar34;
            uStack_150 = uVar35;
            uStack_14c = uVar36;
            fVar37 = sqrtf(fVar37);
            fVar29 = local_178;
            fVar28 = (float)local_188;
            fVar33 = local_158;
            fVar32 = local_168;
          }
          else {
            fVar37 = SQRT(fVar37);
          }
          fVar37 = 1.0 / fVar37;
          fVar28 = atan2f(fVar37 * fVar32 * fVar21 +
                          fVar33 * fVar37 * fVar23 + fVar29 * fVar37 * fVar31,
                          fVar25 * fVar21 + fVar26 * fVar23 + fVar28 * fVar31);
          fVar28 = 3.1415927 - fVar28;
          fVar21 = local_1a0.m_floats[2] * fVar21 +
                   local_1a0.m_floats[0] * fVar23 + local_1a0.m_floats[1] * fVar31;
          bVar20 = fVar21 < 0.0;
          if (0.0 <= fVar21) {
            fVar28 = -fVar28;
          }
        }
        else {
          bVar20 = false;
        }
        iVar6 = (int)(lVar7 + lVar15);
        if (iVar6 == 3) {
          pbVar9 = this->m_triangleVerticesA;
          fVar25 = pbVar9[1].m_floats[2] - pbVar9[2].m_floats[2];
          fVar23 = (float)*(undefined8 *)pbVar9[1].m_floats -
                   (float)*(undefined8 *)pbVar9[2].m_floats;
          fVar24 = (float)((ulong)*(undefined8 *)pbVar9[1].m_floats >> 0x20) -
                   (float)((ulong)*(undefined8 *)pbVar9[2].m_floats >> 0x20);
          fVar21 = fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24;
          if (fVar21 < 0.0) {
            fVar21 = sqrtf(fVar21);
          }
          else {
            fVar21 = SQRT(fVar21);
          }
          fVar26 = sinf(fVar28 * -0.5);
          fVar26 = fVar26 / fVar21;
          local_140.super_btQuadWord.m_floats[3] = cosf(fVar28 * -0.5);
          local_140.super_btQuadWord.m_floats[0] = fVar23 * fVar26;
          local_140.super_btQuadWord.m_floats[1] = fVar24 * fVar26;
          local_140.super_btQuadWord.m_floats[2] = fVar25 * fVar26;
          bVar41 = quatRotate(&local_140,&local_1a0);
          if (bVar41.m_floats[2] * local_1d0.m_floats[2] +
              local_1d0.m_floats[0] * bVar41.m_floats[0] +
              bVar41.m_floats[1] * local_1d0.m_floats[1] < 0.0) {
            *(byte *)&local_190->m_flags = (byte)local_190->m_flags | 0x10;
          }
          local_190->m_edgeV1V2Angle = -fVar28;
          if (bVar20) {
            *(byte *)&local_190->m_flags = (byte)local_190->m_flags | 2;
          }
        }
        else if (iVar6 == 2) {
          pbVar9 = this->m_triangleVerticesA;
          fVar25 = pbVar9[2].m_floats[2] - pbVar9->m_floats[2];
          fVar23 = (float)*(undefined8 *)pbVar9[2].m_floats - (float)*(undefined8 *)pbVar9->m_floats
          ;
          fVar24 = (float)((ulong)*(undefined8 *)pbVar9[2].m_floats >> 0x20) -
                   (float)((ulong)*(undefined8 *)pbVar9->m_floats >> 0x20);
          fVar21 = fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24;
          if (fVar21 < 0.0) {
            fVar21 = sqrtf(fVar21);
          }
          else {
            fVar21 = SQRT(fVar21);
          }
          fVar26 = sinf(fVar28 * -0.5);
          fVar26 = fVar26 / fVar21;
          local_140.super_btQuadWord.m_floats[3] = cosf(fVar28 * -0.5);
          local_140.super_btQuadWord.m_floats[0] = fVar23 * fVar26;
          local_140.super_btQuadWord.m_floats[1] = fVar24 * fVar26;
          local_140.super_btQuadWord.m_floats[2] = fVar25 * fVar26;
          bVar41 = quatRotate(&local_140,&local_1a0);
          if (bVar41.m_floats[2] * local_1d0.m_floats[2] +
              local_1d0.m_floats[0] * bVar41.m_floats[0] +
              bVar41.m_floats[1] * local_1d0.m_floats[1] < 0.0) {
            *(byte *)&local_190->m_flags = (byte)local_190->m_flags | 0x20;
          }
          local_190->m_edgeV2V0Angle = -fVar28;
          if (bVar20) {
            *(byte *)&local_190->m_flags = (byte)local_190->m_flags | 4;
          }
        }
        else if (iVar6 == 1) {
          pbVar9 = this->m_triangleVerticesA;
          fVar25 = pbVar9->m_floats[2] - pbVar9[1].m_floats[2];
          fVar23 = (float)*(undefined8 *)pbVar9->m_floats - (float)*(undefined8 *)pbVar9[1].m_floats
          ;
          fVar24 = (float)((ulong)*(undefined8 *)pbVar9->m_floats >> 0x20) -
                   (float)((ulong)*(undefined8 *)pbVar9[1].m_floats >> 0x20);
          fVar21 = fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24;
          if (fVar21 < 0.0) {
            fVar21 = sqrtf(fVar21);
          }
          else {
            fVar21 = SQRT(fVar21);
          }
          fVar26 = sinf(fVar28 * -0.5);
          fVar26 = fVar26 / fVar21;
          local_140.super_btQuadWord.m_floats[3] = cosf(fVar28 * -0.5);
          local_140.super_btQuadWord.m_floats[0] = fVar23 * fVar26;
          local_140.super_btQuadWord.m_floats[1] = fVar24 * fVar26;
          local_140.super_btQuadWord.m_floats[2] = fVar25 * fVar26;
          bVar41 = quatRotate(&local_140,&local_1a0);
          if (bVar41.m_floats[2] * local_1d0.m_floats[2] +
              local_1d0.m_floats[0] * bVar41.m_floats[0] +
              bVar41.m_floats[1] * local_1d0.m_floats[1] < 0.0) {
            *(byte *)&local_190->m_flags = (byte)local_190->m_flags | 8;
          }
          local_190->m_edgeV0V1Angle = -fVar28;
          if (bVar20) {
            *(byte *)&local_190->m_flags = (byte)local_190->m_flags | 1;
          }
        }
        btPolyhedralConvexShape::~btPolyhedralConvexShape(&local_130.super_btPolyhedralConvexShape);
        btPolyhedralConvexShape::~btPolyhedralConvexShape((btPolyhedralConvexShape *)local_b0);
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3]={-1,-1,-1};
		int sharedVertsB[3]={-1,-1,-1};

		///skip degenerate triangles
		btScalar crossBSqr = ((triangle[1]-triangle[0]).cross(triangle[2]-triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;


		btScalar crossASqr = ((m_triangleVerticesA[1]-m_triangleVerticesA[0]).cross(m_triangleVerticesA[2]-m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr< m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i=0;i<3;i++)
		{
			for (int j=0;j<3;j++)
			{
				if ( (m_triangleVerticesA[i]-triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if(numshared >= 3)
						return;
				}
			}
			///degenerate case
			if(numshared >= 3)
				return;
		}
		switch (numshared)
		{
		case 0:
			{
				break;
			}
		case 1:
			{
				//shared vertex
				break;
			}
		case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = btGetHash(m_partIdA,m_triangleIndexA);

				btTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					btTriangleInfo tmp;
					m_triangleInfoMap->insert(hash,tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0]+sharedVertsA[1];
				int otherIndexA = 3-sumvertsA;

				
				btVector3 edge(m_triangleVerticesA[sharedVertsA[1]]-m_triangleVerticesA[sharedVertsA[0]]);

				btTriangleShape tA(m_triangleVerticesA[0],m_triangleVerticesA[1],m_triangleVerticesA[2]);
				int otherIndexB = 3-(sharedVertsB[0]+sharedVertsB[1]);

				btTriangleShape tB(triangle[sharedVertsB[1]],triangle[sharedVertsB[0]],triangle[otherIndexB]);
				//btTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				btVector3 normalA;
				btVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				btVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					btVector3 tmp = m_triangleVerticesA[otherIndexA]-m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA*=-1;
					}
				}

				btVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					btVector3 tmp = triangle[otherIndexB]-triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB*=-1;
					}
				}

				btScalar	angle2 = 0;
				btScalar	ang4 = 0.f;


				btVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				btScalar len2 = calculatedEdge.length2();

				btScalar correctedAngle(0);
				//btVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2<m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				} else
				{

					calculatedEdge.normalize();
					btVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = btGetAngle(calculatedNormalA,edgeCrossA,edgeCrossB);
					ang4 = SIMD_PI-angle2;
					btScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA<0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				

				
							
				//alternatively use 
				//btVector3 calculatedNormalB2 = quatRotate(orn,normalA);


				switch (sumvertsA)
				{
				case 1:
					{
						btVector3 edge = m_triangleVerticesA[0]-m_triangleVerticesA[1];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						btScalar bla = computedNormalB.dot(normalB);
						if (bla<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif//DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
				case 2:
					{
						btVector3 edge = m_triangleVerticesA[2]-m_triangleVerticesA[0];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;	
					}
				case 3:
					{
						btVector3 edge = m_triangleVerticesA[1]-m_triangleVerticesA[2];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB*=-1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
		default:
			{
				//				printf("warning: duplicate triangle\n");
			}

		}
	}